

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discover.cc
# Opt level: O3

void __thiscall rcdiscover::Discover::Discover(Discover *this)

{
  SocketLinux *pSVar1;
  SocketLinux *socket;
  SocketLinux *this_00;
  
  SocketLinux::createAndBindForAllInterfaces(&this->sockets_,0xf74);
  (this->req_nums_).
  super__Vector_base<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->req_nums_).
  super__Vector_base<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->req_nums_).
  super__Vector_base<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->sockets_).
           super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->sockets_).
                 super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1
      ) {
    SocketLinux::enableBroadcastImpl(this_00);
    SocketLinux::enableNonBlockingImpl(this_00);
  }
  return;
}

Assistant:

Discover::Discover() :
  sockets_(SocketType::createAndBindForAllInterfaces(3956))
{
  for (auto &socket : sockets_)
  {
    socket.enableBroadcast();
    socket.enableNonBlocking();
  }
}